

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O3

boolean encode_mcu_gather(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  ushort uVar1;
  jpeg_entropy_encoder *pjVar2;
  JBLOCKROW paJVar3;
  _func_boolean_j_compress_ptr_JBLOCKROW_ptr *p_Var4;
  _func_void_j_compress_ptr *p_Var5;
  int *piVar6;
  jpeg_error_mgr *pjVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  ushort uVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    uVar10 = *(uint *)&pjVar2[2].encode_mcu;
    if ((*(uint *)&pjVar2[2].encode_mcu == 0) &&
       (uVar10 = cinfo->restart_interval, 0 < cinfo->comps_in_scan)) {
      lVar11 = 0;
      do {
        *(undefined4 *)((long)&pjVar2[1].encode_mcu + lVar11 * 4 + 4) = 0;
        lVar11 = lVar11 + 1;
      } while (lVar11 < cinfo->comps_in_scan);
      uVar10 = cinfo->restart_interval;
    }
    *(uint *)&pjVar2[2].encode_mcu = uVar10 - 1;
  }
  if (0 < cinfo->blocks_in_MCU) {
    lVar11 = 0;
    do {
      lVar15 = (long)cinfo->MCU_membership[lVar11];
      paJVar3 = MCU_data[lVar11];
      p_Var4 = (&pjVar2[5].encode_mcu)[cinfo->cur_comp_info[lVar15]->dc_tbl_no];
      p_Var5 = (&pjVar2[6].finish_pass)[cinfo->cur_comp_info[lVar15]->ac_tbl_no];
      uVar10 = cinfo->lim_Se;
      piVar6 = cinfo->natural_order;
      uVar16 = 0;
      uVar8 = (int)(*paJVar3)[0] - *(int *)((long)&pjVar2[1].encode_mcu + lVar15 * 4 + 4);
      if (uVar8 != 0) {
        uVar9 = -uVar8;
        if (0 < (int)uVar8) {
          uVar9 = uVar8;
        }
        uVar16 = (ulong)uVar9;
        uVar8 = 0xffffffff;
        do {
          uVar9 = uVar8;
          uVar8 = uVar9 + 1;
          uVar13 = (uint)uVar16;
          uVar16 = uVar16 >> 1;
        } while (1 < uVar13);
        uVar16 = (ulong)(uVar9 + 2);
        if (10 < uVar8) {
          pjVar7 = cinfo->err;
          pjVar7->msg_code = 6;
          (*pjVar7->error_exit)((j_common_ptr)cinfo);
        }
      }
      *(long *)(p_Var4 + uVar16 * 8) = *(long *)(p_Var4 + uVar16 * 8) + 1;
      if (0 < (int)uVar10) {
        lVar18 = (ulong)uVar10 + 1;
        lVar17 = 1;
        uVar10 = 0;
        do {
          while (uVar8 = uVar10, uVar1 = (*paJVar3)[piVar6[lVar17]], uVar1 == 0) {
            lVar17 = lVar17 + 1;
            uVar10 = uVar8 + 1;
            if (lVar17 == lVar18) {
              if (-1 < (int)uVar8) {
                *(long *)p_Var5 = *(long *)p_Var5 + 1;
              }
              goto LAB_001d52af;
            }
          }
          if (0xf < (int)uVar8) {
            iVar14 = uVar8 - 0x1f;
            if (uVar8 < 0x1f) {
              iVar14 = 0;
            }
            uVar8 = (uVar8 - (iVar14 + 0xfU & 0x7ffffff0)) - 0x10;
            *(ulong *)(p_Var5 + 0x780) = *(long *)(p_Var5 + 0x780) + (ulong)(iVar14 + 0xfU >> 4) + 1
            ;
          }
          uVar12 = -uVar1;
          if (0 < (short)uVar1) {
            uVar12 = uVar1;
          }
          iVar14 = 1;
          if (1 < uVar12) {
            uVar16 = (ulong)uVar12;
            uVar10 = 0;
            do {
              uVar9 = uVar10;
              uVar10 = uVar9 + 1;
              uVar13 = (uint)uVar16;
              uVar16 = uVar16 >> 1;
            } while (3 < uVar13);
            iVar14 = uVar9 + 2;
            if (9 < uVar10) {
              pjVar7 = cinfo->err;
              pjVar7->msg_code = 6;
              (*pjVar7->error_exit)((j_common_ptr)cinfo);
            }
          }
          *(long *)(p_Var5 + (long)(int)(uVar8 * 0x10 + iVar14) * 8) =
               *(long *)(p_Var5 + (long)(int)(uVar8 * 0x10 + iVar14) * 8) + 1;
          lVar17 = lVar17 + 1;
          uVar10 = 0;
        } while (lVar17 != lVar18);
      }
LAB_001d52af:
      *(int *)((long)&pjVar2[1].encode_mcu + lVar15 * 4 + 4) = (int)(*MCU_data[lVar11])[0];
      lVar11 = lVar11 + 1;
    } while (lVar11 < cinfo->blocks_in_MCU);
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_gather (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  int blkn, ci;
  jpeg_component_info * compptr;

  /* Take care of restart intervals if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      /* Re-initialize DC predictions to 0 */
      for (ci = 0; ci < cinfo->comps_in_scan; ci++)
	entropy->saved.last_dc_val[ci] = 0;
      /* Update restart state */
      entropy->restarts_to_go = cinfo->restart_interval;
    }
    entropy->restarts_to_go--;
  }

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];
    htest_one_block(cinfo, MCU_data[blkn][0], entropy->saved.last_dc_val[ci],
		    entropy->dc_count_ptrs[compptr->dc_tbl_no],
		    entropy->ac_count_ptrs[compptr->ac_tbl_no]);
    entropy->saved.last_dc_val[ci] = MCU_data[blkn][0][0];
  }

  return TRUE;
}